

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeRecordCompareWithSkip(int nKey1,void *pKey1,UnpackedRecord *pPKey2,int bSkip)

{
  double dVar1;
  ushort uVar2;
  uint uVar3;
  KeyInfo *pKVar4;
  u8 uVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  char *__s2;
  ulong uVar12;
  uint uVar13;
  u64 v;
  undefined4 uVar14;
  uint uVar15;
  Mem *pMem2;
  ulong local_b8;
  uint local_ac;
  UnpackedRecord *local_a8;
  u8 *local_a0;
  uint local_94;
  void *local_90;
  double local_88;
  long local_78;
  uint local_6c;
  Mem mem1;
  
  pMem2 = pPKey2->aMem;
  local_a8 = pPKey2;
  if (bSkip == 0) {
    if (*pKey1 < '\0') {
      bVar6 = sqlite3GetVarint32((uchar *)pKey1,&local_6c);
      uVar11 = (uint)bVar6;
    }
    else {
      uVar11 = 1;
      local_6c = (int)*pKey1;
    }
    local_b8 = 0;
    uVar15 = local_6c;
    goto LAB_0016fb83;
  }
  if (*(char *)((long)pKey1 + 1) < '\0') {
    uVar5 = sqlite3GetVarint32((uchar *)((long)pKey1 + 1),(u32 *)&mem1);
    uVar11 = (uint)(byte)(uVar5 + 1);
    local_6c = (uint)*pKey1;
    uVar14 = mem1.u.nZero;
    if ((uint)mem1.u.nZero < 0x80) goto LAB_0016fb4c;
    uVar15 = mem1.u.nZero - 0xcU >> 1;
  }
  else {
    local_6c = (uint)*pKey1;
    uVar11 = 2;
    uVar14 = (int)*(char *)((long)pKey1 + 1);
LAB_0016fb4c:
    uVar15 = (uint)""[(uint)uVar14];
  }
  pMem2 = pMem2 + 1;
  local_b8 = 1;
  uVar15 = uVar15 + local_6c;
LAB_0016fb83:
  if ((uint)nKey1 < uVar15) {
    iVar7 = sqlite3CorruptError(0x13b66);
    local_a8->errCode = (u8)iVar7;
LAB_0016fb9c:
    iVar7 = 0;
  }
  else {
    local_a0 = &local_a8->errCode;
    local_94 = local_6c;
    local_90 = pKey1;
    do {
      uVar2 = pMem2->flags;
      uVar8 = (ulong)uVar11;
      uVar12 = (ulong)uVar15;
      if ((uVar2 & 0x24) == 0) {
        if ((uVar2 & 8) != 0) {
          bVar6 = *(byte *)((long)pKey1 + uVar8);
          v = (u64)bVar6;
          if (9 < bVar6) goto LAB_0016ff9d;
          if (bVar6 == 0) goto LAB_0016ffaa;
          sqlite3VdbeSerialGet((uchar *)(uVar12 + (long)pKey1),(uint)bVar6,&mem1);
          dVar1 = (pMem2->u).r;
          if (bVar6 == 7) {
            if (dVar1 <= (double)CONCAT44(mem1.u.i._4_4_,mem1.u.nZero)) {
              v = 7;
              if (dVar1 < (double)CONCAT44(mem1.u.i._4_4_,mem1.u.nZero)) goto LAB_0016ffa5;
              goto LAB_0016fecc;
            }
          }
          else if (dVar1 <= (double)CONCAT44(mem1.u.i._4_4_,mem1.u.nZero)) {
            uVar13 = (uint)(dVar1 < (double)CONCAT44(mem1.u.i._4_4_,mem1.u.nZero));
            local_88 = dVar1;
            goto LAB_0016fc84;
          }
          goto LAB_0016ffa1;
        }
        if ((uVar2 & 2) == 0) {
          bVar6 = *(byte *)((long)pKey1 + uVar8);
          v = (u64)bVar6;
          if ((uVar2 & 0x10) == 0) {
            uVar13 = (uint)(bVar6 != 0);
          }
          else {
            if ((char)bVar6 < '\0') {
              sqlite3GetVarint32((uchar *)(uVar8 + (long)pKey1),&local_ac);
              v = (u64)local_ac;
            }
            if ((uint)v < 0xc) goto LAB_0016ffaa;
            if ((v & 1) != 0) goto LAB_0016ffa1;
            uVar10 = (uint)v - 0xc >> 1;
            if ((uint)nKey1 < uVar10 + uVar15) {
              iVar7 = 0x13bd1;
              goto LAB_0016ffec;
            }
            if ((pMem2->flags & 0x4000) == 0) {
              uVar3 = pMem2->n;
              uVar13 = uVar10 - uVar3;
              if ((int)uVar10 < (int)uVar3) {
                uVar3 = uVar10;
              }
              __s2 = pMem2->z;
              goto LAB_0016ff5c;
            }
            iVar7 = isAllZero((char *)(uVar12 + (long)pKey1),uVar10);
            if (iVar7 == 0) goto LAB_0016ff9d;
            uVar13 = uVar10 - (pMem2->u).nZero;
          }
LAB_0016fc84:
          uVar10 = uVar13;
          if (uVar10 != 0) goto LAB_0016ffb1;
          goto LAB_0016fecc;
        }
        uVar13 = (int)*(char *)((long)pKey1 + uVar8);
        if (*(char *)((long)pKey1 + uVar8) < 0) {
          sqlite3GetVarint32((uchar *)(uVar8 + (long)pKey1),&local_ac);
          uVar13 = local_ac;
        }
        v = (u64)uVar13;
        if (uVar13 < 0xc) {
LAB_0016ffaa:
          uVar10 = 0xffffffff;
          goto LAB_0016ffb1;
        }
        if ((uVar13 & 1) == 0) goto LAB_0016ffa5;
        mem1.n = uVar13 - 0xc >> 1;
        if ((mem1.n + uVar15 <= (uint)nKey1) &&
           (pKVar4 = local_a8->pKeyInfo, local_b8 < pKVar4->nAllField)) {
          if (pKVar4->aColl[local_b8] == (CollSeq *)0x0) {
            uVar3 = pMem2->n;
            uVar13 = mem1.n - uVar3;
            if (mem1.n < (int)uVar3) {
              uVar3 = mem1.n;
            }
            __s2 = pMem2->z;
LAB_0016ff5c:
            uVar10 = memcmp((void *)(uVar12 + (long)pKey1),__s2,(long)(int)uVar3);
            if (uVar10 != 0) goto LAB_0016ffb1;
          }
          else {
            mem1.enc = pKVar4->enc;
            mem1.db = pKVar4->db;
            mem1.flags = 2;
            mem1.z = (char *)(uVar12 + (long)pKey1);
            uVar13 = vdbeCompareMemString(&mem1,pMem2,pKVar4->aColl[local_b8],local_a0);
          }
          goto LAB_0016fc84;
        }
        iVar7 = 0x13bb3;
LAB_0016ffec:
        iVar7 = sqlite3CorruptError(iVar7);
        *local_a0 = (u8)iVar7;
        goto LAB_0016fb9c;
      }
      bVar6 = *(byte *)((long)pKey1 + uVar8);
      v = (u64)bVar6;
      if (9 < bVar6) {
LAB_0016ff9d:
        uVar10 = 1;
        goto LAB_0016ffb1;
      }
      if (bVar6 == 7) {
        sqlite3VdbeSerialGet((uchar *)(uVar12 + (long)pKey1),7,&mem1);
        local_78 = (pMem2->u).i;
        if ((double)CONCAT44(mem1.u.i._4_4_,mem1.u.nZero) <= (double)local_78) {
          v = 7;
          uVar13 = -(uint)((double)CONCAT44(mem1.u.i._4_4_,mem1.u.nZero) < (double)local_78);
          goto LAB_0016fc84;
        }
        goto LAB_0016ff9d;
      }
      if (bVar6 == 0) goto LAB_0016ffa1;
      switch(bVar6) {
      case 1:
        uVar8 = (ulong)*(char *)((long)pKey1 + uVar12);
        goto LAB_0016febd;
      case 2:
        uVar9 = (long)*(char *)((long)pKey1 + uVar12) << 8;
        uVar8 = (ulong)*(byte *)((long)pKey1 + uVar12 + 1);
        break;
      case 3:
        uVar9 = (ulong)*(byte *)((long)pKey1 + uVar12 + 1) << 8 |
                (long)*(char *)((long)pKey1 + uVar12) << 0x10;
        uVar8 = (ulong)*(byte *)((long)pKey1 + uVar12 + 2);
        break;
      case 4:
        uVar9 = (ulong)*(byte *)((long)pKey1 + uVar12 + 2) << 8 |
                (long)(int)((uint)*(byte *)((long)pKey1 + uVar12) << 0x18) |
                (ulong)*(byte *)((long)pKey1 + uVar12 + 1) << 0x10;
        uVar8 = (ulong)*(byte *)((long)pKey1 + uVar12 + 3);
        break;
      case 5:
        uVar13 = *(uint *)((long)pKey1 + uVar12 + 2);
        uVar9 = (ulong)(uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                       uVar13 << 0x18);
        uVar8 = (ulong)(uint)(int)CONCAT11(*(undefined1 *)((long)pKey1 + uVar12),
                                           *(undefined1 *)((long)pKey1 + uVar12 + 1)) << 0x20;
        break;
      case 6:
        uVar8 = *(ulong *)((long)pKey1 + uVar12);
        uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 |
                uVar8 << 0x38;
        goto LAB_0016febd;
      default:
        uVar8 = (ulong)(bVar6 - 8);
        goto LAB_0016febd;
      }
      uVar8 = uVar8 | uVar9;
LAB_0016febd:
      if ((long)uVar8 < (pMem2->u).i) {
LAB_0016ffa1:
        uVar10 = 0xffffffff;
LAB_0016ffb1:
        if (local_a8->pKeyInfo->aSortOrder[local_b8 & 0xffffffff] != '\0') {
          return -uVar10;
        }
        return uVar10;
      }
      if ((pMem2->u).i < (long)uVar8) {
LAB_0016ffa5:
        uVar10 = 1;
        goto LAB_0016ffb1;
      }
LAB_0016fecc:
      pKey1 = local_90;
      local_b8 = local_b8 + 1;
      if (local_b8 == local_a8->nField) break;
      if ((uint)v < 0x80) {
        uVar13 = (uint)""[v];
      }
      else {
        uVar13 = (uint)v - 0xc >> 1;
      }
      iVar7 = sqlite3VarintLen(v);
      uVar11 = uVar11 + iVar7;
      if (local_94 <= uVar11) break;
      pMem2 = pMem2 + 1;
      uVar15 = uVar13 + uVar15;
    } while (uVar15 <= (uint)nKey1);
    local_a8->eqSeen = '\x01';
    iVar7 = (int)local_a8->default_rc;
  }
  return iVar7;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeRecordCompareWithSkip(
  int nKey1, const void *pKey1,   /* Left key */
  UnpackedRecord *pPKey2,         /* Right key */
  int bSkip                       /* If true, skip the first field */
){
  u32 d1;                         /* Offset into aKey[] of next data element */
  int i;                          /* Index of next field to compare */
  u32 szHdr1;                     /* Size of record header in bytes */
  u32 idx1;                       /* Offset of first type in header */
  int rc = 0;                     /* Return value */
  Mem *pRhs = pPKey2->aMem;       /* Next field of pPKey2 to compare */
  KeyInfo *pKeyInfo;
  const unsigned char *aKey1 = (const unsigned char *)pKey1;
  Mem mem1;

  /* If bSkip is true, then the caller has already determined that the first
  ** two elements in the keys are equal. Fix the various stack variables so
  ** that this routine begins comparing at the second field. */
  if( bSkip ){
    u32 s1;
    idx1 = 1 + getVarint32(&aKey1[1], s1);
    szHdr1 = aKey1[0];
    d1 = szHdr1 + sqlite3VdbeSerialTypeLen(s1);
    i = 1;
    pRhs++;
  }else{
    idx1 = getVarint32(aKey1, szHdr1);
    d1 = szHdr1;
    i = 0;
  }
  if( d1>(unsigned)nKey1 ){ 
    pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
    return 0;  /* Corruption */
  }

  VVA_ONLY( mem1.szMalloc = 0; ) /* Only needed by assert() statements */
  assert( pPKey2->pKeyInfo->nAllField>=pPKey2->nField 
       || CORRUPT_DB );
  assert( pPKey2->pKeyInfo->aSortOrder!=0 );
  assert( pPKey2->pKeyInfo->nKeyField>0 );
  assert( idx1<=szHdr1 || CORRUPT_DB );
  do{
    u32 serial_type;

    /* RHS is an integer */
    if( pRhs->flags & (MEM_Int|MEM_IntReal) ){
      testcase( pRhs->flags & MEM_Int );
      testcase( pRhs->flags & MEM_IntReal );
      serial_type = aKey1[idx1];
      testcase( serial_type==12 );
      if( serial_type>=10 ){
        rc = +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else if( serial_type==7 ){
        sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
        rc = -sqlite3IntFloatCompare(pRhs->u.i, mem1.u.r);
      }else{
        i64 lhs = vdbeRecordDecodeInt(serial_type, &aKey1[d1]);
        i64 rhs = pRhs->u.i;
        if( lhs<rhs ){
          rc = -1;
        }else if( lhs>rhs ){
          rc = +1;
        }
      }
    }

    /* RHS is real */
    else if( pRhs->flags & MEM_Real ){
      serial_type = aKey1[idx1];
      if( serial_type>=10 ){
        /* Serial types 12 or greater are strings and blobs (greater than
        ** numbers). Types 10 and 11 are currently "reserved for future 
        ** use", so it doesn't really matter what the results of comparing
        ** them to numberic values are.  */
        rc = +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else{
        sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
        if( serial_type==7 ){
          if( mem1.u.r<pRhs->u.r ){
            rc = -1;
          }else if( mem1.u.r>pRhs->u.r ){
            rc = +1;
          }
        }else{
          rc = sqlite3IntFloatCompare(mem1.u.i, pRhs->u.r);
        }
      }
    }

    /* RHS is a string */
    else if( pRhs->flags & MEM_Str ){
      getVarint32(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 ){
        rc = -1;
      }else if( !(serial_type & 0x01) ){
        rc = +1;
      }else{
        mem1.n = (serial_type - 12) / 2;
        testcase( (d1+mem1.n)==(unsigned)nKey1 );
        testcase( (d1+mem1.n+1)==(unsigned)nKey1 );
        if( (d1+mem1.n) > (unsigned)nKey1
         || (pKeyInfo = pPKey2->pKeyInfo)->nAllField<=i
        ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pKeyInfo->aColl[i] ){
          mem1.enc = pKeyInfo->enc;
          mem1.db = pKeyInfo->db;
          mem1.flags = MEM_Str;
          mem1.z = (char*)&aKey1[d1];
          rc = vdbeCompareMemString(
              &mem1, pRhs, pKeyInfo->aColl[i], &pPKey2->errCode
          );
        }else{
          int nCmp = MIN(mem1.n, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = mem1.n - pRhs->n; 
        }
      }
    }

    /* RHS is a blob */
    else if( pRhs->flags & MEM_Blob ){
      assert( (pRhs->flags & MEM_Zero)==0 || pRhs->n==0 );
      getVarint32(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 || (serial_type & 0x01) ){
        rc = -1;
      }else{
        int nStr = (serial_type - 12) / 2;
        testcase( (d1+nStr)==(unsigned)nKey1 );
        testcase( (d1+nStr+1)==(unsigned)nKey1 );
        if( (d1+nStr) > (unsigned)nKey1 ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pRhs->flags & MEM_Zero ){
          if( !isAllZero((const char*)&aKey1[d1],nStr) ){
            rc = 1;
          }else{
            rc = nStr - pRhs->u.nZero;
          }
        }else{
          int nCmp = MIN(nStr, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = nStr - pRhs->n;
        }
      }
    }

    /* RHS is null */
    else{
      serial_type = aKey1[idx1];
      rc = (serial_type!=0);
    }

    if( rc!=0 ){
      if( pPKey2->pKeyInfo->aSortOrder[i] ){
        rc = -rc;
      }
      assert( vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, rc) );
      assert( mem1.szMalloc==0 );  /* See comment below */
      return rc;
    }

    i++;
    if( i==pPKey2->nField ) break;
    pRhs++;
    d1 += sqlite3VdbeSerialTypeLen(serial_type);
    idx1 += sqlite3VarintLen(serial_type);
  }while( idx1<(unsigned)szHdr1 && d1<=(unsigned)nKey1 );

  /* No memory allocation is ever used on mem1.  Prove this using
  ** the following assert().  If the assert() fails, it indicates a
  ** memory leak and a need to call sqlite3VdbeMemRelease(&mem1).  */
  assert( mem1.szMalloc==0 );

  /* rc==0 here means that one or both of the keys ran out of fields and
  ** all the fields up to that point were equal. Return the default_rc
  ** value.  */
  assert( CORRUPT_DB 
       || vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, pPKey2->default_rc) 
       || pPKey2->pKeyInfo->db->mallocFailed
  );
  pPKey2->eqSeen = 1;
  return pPKey2->default_rc;
}